

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var.cpp
# Opt level: O0

IntVar * getConstant(int v)

{
  bool bVar1;
  pointer ppVar2;
  ostream *this;
  IntVar *this_00;
  int in_EDI;
  stringstream ss;
  IntVar *var;
  iterator it;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  IntVar **in_stack_fffffffffffffdf0;
  string *this_01;
  undefined8 in_stack_fffffffffffffe00;
  string local_1e0 [8];
  key_type *in_stack_fffffffffffffe28;
  map<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IntVar_*>,_std::allocator<std::pair<IntVar_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffe30;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  IntVar *local_28;
  _Self local_20;
  _Self local_18;
  int local_c;
  IntVar *local_8;
  
  local_c = in_EDI;
  local_18._M_node =
       (_Base_ptr)
       std::map<int,_IntVar_*,_std::less<int>,_std::allocator<std::pair<const_int,_IntVar_*>_>_>::
       find((map<int,_IntVar_*,_std::less<int>,_std::allocator<std::pair<const_int,_IntVar_*>_>_> *)
            CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),(key_type *)0x16c222);
  local_20._M_node =
       (_Base_ptr)
       std::map<int,_IntVar_*,_std::less<int>,_std::allocator<std::pair<const_int,_IntVar_*>_>_>::
       end((map<int,_IntVar_*,_std::less<int>,_std::allocator<std::pair<const_int,_IntVar_*>_>_> *)
           CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8));
  bVar1 = std::operator!=(&local_18,&local_20);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_IntVar_*>_>::operator->
                       ((_Rb_tree_iterator<std::pair<const_int,_IntVar_*>_> *)0x16c266);
    local_8 = ppVar2->second;
  }
  else {
    local_28 = newIntVar((int)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                         (int)in_stack_fffffffffffffe00);
    std::__cxx11::stringstream::stringstream(local_1b0);
    this = std::operator<<(local_1a0,"constant_");
    std::ostream::operator<<(this,local_c);
    std::__cxx11::stringstream::str();
    this_00 = (IntVar *)
              std::
              map<IntVar_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<IntVar_*>,_std::allocator<std::pair<IntVar_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    this_01 = local_1e0;
    std::__cxx11::string::operator=((string *)this_00,this_01);
    std::__cxx11::string::~string(this_01);
    IntVar::specialiseToEL(this_00);
    std::map<int,IntVar*,std::less<int>,std::allocator<std::pair<int_const,IntVar*>>>::
    emplace<int&,IntVar*&>
              ((map<int,_IntVar_*,_std::less<int>,_std::allocator<std::pair<const_int,_IntVar_*>_>_>
                *)this_00,(int *)this_01,in_stack_fffffffffffffdf0);
    local_8 = local_28;
    std::__cxx11::stringstream::~stringstream(local_1b0);
  }
  return local_8;
}

Assistant:

IntVar* getConstant(int v) {
	auto it = ic_map.find(v);
	if (it != ic_map.end()) {
		return it->second;
	}
	IntVar* var = newIntVar(v, v);

	std::stringstream ss;
	ss << "constant_" << v;
	intVarString[var] = ss.str();

	var->specialiseToEL();
	ic_map.emplace(v, var);

	return var;
}